

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void __thiscall
gnuplotio::PlotData::
PlotData<std::tuple<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,gnuplotio::Mode1D,gnuplotio::ModeBinary>
          (PlotData *this,undefined4 *arg,long *_plotspec,long *_arr_or_rec)

{
  ostringstream tmp;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->plotspec)._M_dataplus._M_p = (pointer)&(this->plotspec).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,*_plotspec,_plotspec[1] + *_plotspec);
  this->is_text = false;
  this->is_inline = true;
  this->has_data = true;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->arr_or_rec)._M_dataplus._M_p = (pointer)&(this->arr_or_rec).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arr_or_rec,*_arr_or_rec,_arr_or_rec[1] + *_arr_or_rec);
  (this->bin_fmt)._M_dataplus._M_p = (pointer)&(this->bin_fmt).field_2;
  (this->bin_fmt)._M_string_length = 0;
  (this->bin_fmt).field_2._M_local_buf[0] = '\0';
  (this->bin_size)._M_dataplus._M_p = (pointer)&(this->bin_size).field_2;
  (this->bin_size)._M_string_length = 0;
  (this->bin_size).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1b8 = *arg;
  uStack_1b4 = arg[1];
  uStack_1b0 = arg[2];
  uStack_1ac = arg[3];
  local_1c8 = arg[6];
  uStack_1c4 = arg[7];
  uStack_1c0 = arg[8];
  uStack_1bc = arg[9];
  local_1d8 = arg[0xc];
  uStack_1d4 = arg[0xd];
  uStack_1d0 = arg[0xe];
  uStack_1cc = arg[0xf];
  print_block<1ul,gnuplotio::PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>,gnuplotio::ModeBinary>
            (local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->data,(string *)&local_1d8);
  if ((undefined4 *)CONCAT44(uStack_1d4,local_1d8) != &local_1c8) {
    operator_delete((undefined4 *)CONCAT44(uStack_1d4,local_1d8),CONCAT44(uStack_1c4,local_1c8) + 1)
    ;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->is_text == false) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    local_1b8 = *arg;
    uStack_1b4 = arg[1];
    uStack_1b0 = arg[2];
    uStack_1ac = arg[3];
    local_1c8 = arg[6];
    uStack_1c4 = arg[7];
    uStack_1c0 = arg[8];
    uStack_1bc = arg[9];
    local_1d8 = arg[0xc];
    uStack_1d4 = arg[0xd];
    uStack_1d0 = arg[0xe];
    uStack_1cc = arg[0xf];
    print_block<1ul,gnuplotio::PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>,gnuplotio::ModeBinfmt>
              (local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_fmt,(string *)&local_1d8);
    if ((undefined4 *)CONCAT44(uStack_1d4,local_1d8) != &local_1c8) {
      operator_delete((undefined4 *)CONCAT44(uStack_1d4,local_1d8),
                      CONCAT44(uStack_1c4,local_1c8) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    handle_colunwrap_tag<1ul,std::tuple<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,gnuplotio::ModeSize>
              (local_1a8,arg);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_size,(string *)&local_1d8);
    if ((undefined4 *)CONCAT44(uStack_1d4,local_1d8) != &local_1c8) {
      operator_delete((undefined4 *)CONCAT44(uStack_1d4,local_1d8),
                      CONCAT44(uStack_1c4,local_1c8) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

PlotData(
        const T &arg,
        const std::string &_plotspec,
        const std::string &_arr_or_rec,
        OrganizationMode, PrintMode
    ) :
        plotspec(_plotspec),
        is_text(PrintMode::is_text),
        is_inline(true),
        has_data(true),
        arr_or_rec(_arr_or_rec)
    {
        {
            std::ostringstream tmp;
            top_level_array_sender(tmp, arg, OrganizationMode(), PrintMode());
            data = tmp.str();
        }

        if(!is_text) {
            try {
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
                    bin_fmt = tmp.str();
                }
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
                    bin_size = tmp.str();
                }
            } catch(const plotting_empty_container &) {
                bin_fmt = "";
                bin_size = "0";
            }
        }
    }